

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

bool __thiscall
pdqsort_detail::
partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1>
          (pdqsort_detail *this,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
          anon_class_16_2_fd512ddf comp)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  pdqsort_detail *ppVar9;
  ulong uVar10;
  pdqsort_detail *ppVar11;
  long lVar12;
  long lVar13;
  pdqsort_detail *ppVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  double dVar19;
  double dVar20;
  ulong local_48;
  
  if ((this != (pdqsort_detail *)begin._M_current) &&
     (this + 4 != (pdqsort_detail *)begin._M_current)) {
    lVar7 = *(long *)(end._M_current + 0x14);
    lVar16 = 0;
    local_48 = 0;
    ppVar9 = this + 4;
    ppVar14 = this;
    do {
      ppVar11 = ppVar9;
      iVar6 = *(int *)(ppVar14 + 4);
      lVar18 = (long)iVar6;
      dVar2 = *(double *)(lVar7 + lVar18 * 8);
      lVar8 = (long)*(int *)ppVar14;
      if ((1.5 <= dVar2) || (*(double *)(lVar7 + lVar8 * 8) <= 1.5)) {
        if ((dVar2 <= 1.5) ||
           (pdVar1 = (double *)(lVar7 + lVar8 * 8), 1.5 < *pdVar1 || *pdVar1 == 1.5)) {
          dVar3 = *(double *)(*(long *)(end._M_current + 0x30) + lVar18 * 8);
          dVar19 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar18 * 8) * dVar3;
          dVar4 = *(double *)(*(long *)(end._M_current + 0x30) + lVar8 * 8);
          dVar20 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar8 * 8) * dVar4;
          dVar5 = *(double *)(end._M_current + 0x2c);
          if (dVar20 + dVar5 < dVar19) goto LAB_00282b53;
          if (dVar20 - dVar5 <= dVar19) {
            if (ABS(dVar3 - dVar4) <= dVar5) {
              uVar17 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar18 * 4);
              uVar10 = (ulong)*(uint *)&(comp.this)->lpRelaxation;
              lVar15 = uVar10 + 0x8a183895eeac1536;
              lVar12 = uVar10 + 0x80c8963be3e4c2f3;
              uVar10 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar8 * 4);
              if (((uVar10 + 0xc8497d2a400d9551) * lVar12 >> 0x20 ^
                  (uVar10 + 0x42d8680e260ae5b) * lVar15) <
                  ((uVar17 + 0xc8497d2a400d9551) * lVar12 >> 0x20 ^
                  (uVar17 + 0x42d8680e260ae5b) * lVar15)) goto LAB_00282b53;
            }
            else if (dVar4 < dVar3) goto LAB_00282b53;
          }
        }
      }
      else {
LAB_00282b53:
        ppVar9 = ppVar11 + -4;
        *(int *)(ppVar14 + 4) = *(int *)ppVar14;
        ppVar14 = this;
        lVar8 = lVar16;
        if (ppVar9 != this) {
          do {
            lVar15 = (long)*(int *)(this + lVar8 + -4);
            if ((1.5 <= dVar2) || (*(double *)(lVar7 + lVar15 * 8) <= 1.5)) {
              ppVar14 = ppVar9;
              if ((1.5 < dVar2) &&
                 (pdVar1 = (double *)(lVar7 + lVar15 * 8), *pdVar1 <= 1.5 && *pdVar1 != 1.5)) break;
              dVar3 = *(double *)(*(long *)(end._M_current + 0x30) + lVar18 * 8);
              dVar19 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar18 * 8) * dVar3;
              dVar4 = *(double *)(*(long *)(end._M_current + 0x30) + lVar15 * 8);
              dVar20 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar15 * 8) * dVar4;
              dVar5 = *(double *)(end._M_current + 0x2c);
              if (dVar19 <= dVar20 + dVar5) {
                if (dVar19 < dVar20 - dVar5) break;
                if (ABS(dVar3 - dVar4) <= dVar5) {
                  uVar17 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar18 * 4);
                  uVar10 = (ulong)*(uint *)&(comp.this)->lpRelaxation;
                  lVar12 = uVar10 + 0x8a183895eeac1536;
                  lVar13 = uVar10 + 0x80c8963be3e4c2f3;
                  uVar10 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar15 * 4);
                  if (((uVar17 + 0xc8497d2a400d9551) * lVar13 >> 0x20 ^
                      (uVar17 + 0x42d8680e260ae5b) * lVar12) <=
                      ((uVar10 + 0xc8497d2a400d9551) * lVar13 >> 0x20 ^
                      (uVar10 + 0x42d8680e260ae5b) * lVar12)) break;
                }
                else if (dVar3 <= dVar4) {
                  ppVar14 = this + lVar8;
                  break;
                }
              }
            }
            ppVar9 = ppVar9 + -4;
            *(int *)(this + lVar8) = *(int *)(this + lVar8 + -4);
            lVar8 = lVar8 + -4;
            ppVar14 = this;
          } while (lVar8 != 0);
        }
        *(int *)ppVar14 = iVar6;
        local_48 = local_48 + ((long)ppVar11 - (long)ppVar14 >> 2);
        if (8 < local_48) {
          return false;
        }
      }
      lVar16 = lVar16 + 4;
      ppVar9 = ppVar11 + 4;
      ppVar14 = ppVar11;
    } while (ppVar11 + 4 != (pdqsort_detail *)begin._M_current);
  }
  return true;
}

Assistant:

inline bool partial_insertion_sort(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (begin == end) return true;
        
        std::size_t limit = 0;
        for (Iter cur = begin + 1; cur != end; ++cur) {
            Iter sift = cur;
            Iter sift_1 = cur - 1;

            // Compare first so we can avoid 2 moves for an element already positioned correctly.
            if (comp(*sift, *sift_1)) {
                T tmp = PDQSORT_PREFER_MOVE(*sift);

                do { *sift-- = PDQSORT_PREFER_MOVE(*sift_1); }
                while (sift != begin && comp(tmp, *--sift_1));

                *sift = PDQSORT_PREFER_MOVE(tmp);
                limit += cur - sift;
            }
            
            if (limit > partial_insertion_sort_limit) return false;
        }

        return true;
    }